

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

QUrl QUrl::fromEncoded(QByteArrayView input,ParsingMode mode)

{
  long lVar1;
  QUrlPrivate *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffff78;
  QByteArrayView in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::fromUtf8(in_stack_ffffffffffffffd0);
  QUrl((QUrl *)in_RDI,in_stack_ffffffffffffff78,TolerantMode);
  QString::~QString((QString *)0x2fe7de);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QUrl)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QUrl QUrl::fromEncoded(QByteArrayView input, ParsingMode mode)
{
    return QUrl(QString::fromUtf8(input), mode);
}